

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  _List_node_base *p_Var1;
  int listen_port;
  ostream *poVar2;
  Server server;
  Server local_160;
  
  if (argc != 2) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Invalid arguments! Usage: ");
    poVar2 = std::operator<<(poVar2,*argv);
    poVar2 = std::operator<<(poVar2," listen_port");
    std::endl<char,std::char_traits<char>>(poVar2);
    exit(0);
  }
  listen_port = Utils::parse_port(argv[1]);
  Server::Server(&local_160,listen_port);
  Server::run(&local_160);
  while (local_160.connections.super__List_base<Connection_*,_std::allocator<Connection_*>_>._M_impl
         ._M_node.super__List_node_base._M_next != (_List_node_base *)&local_160.connections) {
    p_Var1 = (local_160.connections.super__List_base<Connection_*,_std::allocator<Connection_*>_>.
              _M_impl._M_node.super__List_node_base._M_next)->_M_next;
    operator_delete(local_160.connections.
                    super__List_base<Connection_*,_std::allocator<Connection_*>_>._M_impl._M_node.
                    super__List_node_base._M_next);
    local_160.connections.super__List_base<Connection_*,_std::allocator<Connection_*>_>._M_impl.
    _M_node.super__List_node_base._M_next = p_Var1;
  }
  while (local_160.waitingForHandshake.
         super__List_base<std::pair<int,_SOCK5ConnectionMaker_*>,_std::allocator<std::pair<int,_SOCK5ConnectionMaker_*>_>_>
         ._M_impl._M_node.super__List_node_base._M_next !=
         (_List_node_base *)&local_160.waitingForHandshake) {
    p_Var1 = (local_160.waitingForHandshake.
              super__List_base<std::pair<int,_SOCK5ConnectionMaker_*>,_std::allocator<std::pair<int,_SOCK5ConnectionMaker_*>_>_>
              ._M_impl._M_node.super__List_node_base._M_next)->_M_next;
    operator_delete(local_160.waitingForHandshake.
                    super__List_base<std::pair<int,_SOCK5ConnectionMaker_*>,_std::allocator<std::pair<int,_SOCK5ConnectionMaker_*>_>_>
                    ._M_impl._M_node.super__List_node_base._M_next);
    local_160.waitingForHandshake.
    super__List_base<std::pair<int,_SOCK5ConnectionMaker_*>,_std::allocator<std::pair<int,_SOCK5ConnectionMaker_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = p_Var1;
  }
  while (local_160.waitingForResolve.
         super__List_base<std::pair<std::pair<int,_int>,_DNSResolver_*>,_std::allocator<std::pair<std::pair<int,_int>,_DNSResolver_*>_>_>
         ._M_impl._M_node.super__List_node_base._M_next !=
         (_List_node_base *)&local_160.waitingForResolve) {
    p_Var1 = (local_160.waitingForResolve.
              super__List_base<std::pair<std::pair<int,_int>,_DNSResolver_*>,_std::allocator<std::pair<std::pair<int,_int>,_DNSResolver_*>_>_>
              ._M_impl._M_node.super__List_node_base._M_next)->_M_next;
    operator_delete(local_160.waitingForResolve.
                    super__List_base<std::pair<std::pair<int,_int>,_DNSResolver_*>,_std::allocator<std::pair<std::pair<int,_int>,_DNSResolver_*>_>_>
                    ._M_impl._M_node.super__List_node_base._M_next);
    local_160.waitingForResolve.
    super__List_base<std::pair<std::pair<int,_int>,_DNSResolver_*>,_std::allocator<std::pair<std::pair<int,_int>,_DNSResolver_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = p_Var1;
  }
  return 0;
}

Assistant:

int main(int argc, char** argv) {

    if (argc != 2) {
        std::cerr << "Invalid arguments! Usage: " << argv[0] << " listen_port" << std::endl;
        exit(EXIT_SUCCESS);
    }

    try {
        int listen_port = Utils::parse_port(argv[LISTEN_PORT]);
        Server server(listen_port);
        server.run();
    } catch (std::exception& e) {
        std::cerr << e.what() << std::endl;
    }
    return 0;
}